

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * strtok(char *__s,char *__delim)

{
  char *pcVar1;
  size_t sVar2;
  char *__s_00;
  
  if (__s == (char *)0x0) {
    __s = strtok::last;
  }
  __s_00 = __s + -1;
  do {
    if (__s_00[1] == '\0') {
      return (char *)0x0;
    }
    pcVar1 = strchr(__delim,(int)__s_00[1]);
    __s_00 = __s_00 + 1;
  } while (pcVar1 != (char *)0x0);
  sVar2 = strcspn(__s_00,__delim);
  strtok::last = __s_00 + sVar2;
  if (__s_00[sVar2] != '\0') {
    strtok::last = __s_00 + sVar2 + 1;
    __s_00[sVar2] = '\0';
  }
  return __s_00;
}

Assistant:

char *strtok(char *s, const char *delim) {
    static char *last;

    if (s == NULL) {
        s = last;
    }
    int ch;
    do {
        ch = *s++;
        if (ch == '\0') {
            return NULL;
        }
    } while (strchr(delim, ch));
    --s;
    last = s + strcspn(s, delim);
    if (*last != '\0') {
        *last++ = '\0';
    }
    return s;
}